

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O1

void __thiscall Movegen::initialize(Movegen *this,position *p)

{
  Color CVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  array<std::array<Square,_11UL>,_6UL> *paVar6;
  array<std::array<Square,_11UL>,_6UL> *paVar7;
  array<std::array<Square,_11UL>,_6UL> *paVar8;
  array<std::array<Square,_11UL>,_6UL> *paVar9;
  array<std::array<Square,_11UL>,_6UL> *paVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  ulong *puVar17;
  bool bVar18;
  
  CVar1 = (p->ifo).stm;
  uVar13 = (ulong)CVar1;
  this->us = CVar1;
  this->them = CVar1 ^ black;
  uVar11 = (p->pcs).bycolor._M_elems[1] | (p->pcs).bycolor._M_elems[0];
  this->all_pieces = uVar11;
  uVar11 = ~uVar11;
  this->empty = uVar11;
  uVar15 = 0xfffffff7;
  if (uVar13 == 0) {
    uVar15 = 0xfffffffd;
  }
  uVar14 = (uint)(p->ifo).cmask;
  this->can_castle_ks = ((uint)(uVar13 == 0) * 3 - 5 | uVar14) == 0xffffffff;
  this->can_castle_qs = (uVar15 | uVar14) == 0xffffffff;
  uVar12 = (p->ifo).checkers;
  this->check_target = uVar12;
  this->evasion_target = 0;
  if (uVar12 - 1 < (uVar12 ^ uVar12 - 1)) {
    lVar5 = 0;
    if (uVar12 != 0) {
      for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
      }
    }
    if ((p->pcs).piece_on._M_elems[lVar5] - bishop < 3) {
      this->evasion_target =
           *(ulong *)(bitboards::between +
                     (ulong)(p->ifo).ks[uVar13] * 8 + (ulong)(uint)((int)lVar5 << 9)) & uVar11;
    }
  }
  paVar6 = (p->pcs).square_of._M_elems;
  if (uVar13 != 0) {
    paVar6 = (p->pcs).square_of._M_elems + 1;
  }
  paVar7 = (p->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar7 = (p->pcs).square_of._M_elems;
  }
  paVar8 = (p->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar8 = (p->pcs).square_of._M_elems;
  }
  paVar9 = (p->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar9 = (p->pcs).square_of._M_elems;
  }
  paVar10 = (p->pcs).square_of._M_elems + 1;
  if (uVar13 == 0) {
    paVar10 = (p->pcs).square_of._M_elems;
  }
  puVar17 = &DAT_00141b78;
  puVar16 = &DAT_00141ba0;
  bVar18 = uVar13 == 0;
  if (bVar18) {
    puVar17 = puVar16;
    puVar16 = &DAT_00141b78;
  }
  uVar13 = *puVar16;
  this->rank2 = uVar13;
  uVar2 = *puVar17;
  this->rank7 = uVar2;
  uVar3 = (p->pcs).bitmap._M_elems[!bVar18]._M_elems[0];
  this->pawns = uVar3;
  this->knights = (Square *)((long)(paVar10->_M_elems + 1) + 4);
  this->bishops = (Square *)((long)(paVar9->_M_elems + 2) + 4);
  this->rooks = (Square *)((long)(paVar8->_M_elems + 3) + 4);
  this->queens = (Square *)((long)(paVar7->_M_elems + 4) + 4);
  this->kings = (Square *)((long)(paVar6->_M_elems + 5) + 4);
  uVar4 = (p->pcs).bycolor._M_elems[bVar18];
  this->enemies = uVar4;
  if (this->evasion_target != 0) {
    uVar11 = this->evasion_target;
  }
  if (uVar12 == 0) {
    uVar12 = uVar4;
  }
  this->qtarget = uVar11;
  this->ctarget = uVar12;
  this->eps = (p->ifo).eps;
  this->pawns2 = uVar13 & uVar3;
  this->pawns7 = uVar2 & uVar3;
  return;
}

Assistant:

inline Color to_move() const { return ifo.stm; }